

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O3

void sum_cols_int_check_nulls(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  AssertionHandler catchAssertionHandler;
  int local_dc;
  sqlite3_context *local_d8;
  undefined4 local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  int *local_a8;
  char *local_a0;
  size_t sStack_98;
  undefined4 *local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_b8._vptr_ITransientExpression = (_func_int **)0x18243f;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0x18;
  local_dc = argc;
  local_d8 = context;
  Catch::StringRef::StringRef(&local_40,"argc > 0");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_cc = 0;
  Catch::StringRef::StringRef((StringRef *)&local_c8,">");
  local_b8.m_result = 0 < argc;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b2c68;
  local_a8 = &local_dc;
  local_a0 = local_c8.file;
  sStack_98 = local_c8.line;
  local_90 = &local_cc;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  if (local_dc < 1) {
    iVar2 = 0;
LAB_0017ca79:
    duckdb_shell_sqlite3_result_int(local_d8,iVar2);
  }
  else {
    lVar4 = 0;
    bVar3 = false;
    iVar2 = 0;
    do {
      while (iVar1 = duckdb_shell_sqlite3_value_type(argv[lVar4]), iVar1 != 5) {
        iVar1 = duckdb_shell_sqlite3_value_int(argv[lVar4]);
        iVar2 = iVar2 + iVar1;
        lVar4 = lVar4 + 1;
        if (local_dc <= lVar4) {
          if (!bVar3) goto LAB_0017ca79;
          goto LAB_0017ca6b;
        }
      }
      lVar4 = lVar4 + 1;
      bVar3 = true;
    } while (lVar4 < local_dc);
LAB_0017ca6b:
    duckdb_shell_sqlite3_result_null(local_d8);
  }
  return;
}

Assistant:

static void sum_cols_int_check_nulls(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = 0;
	int res_type = SQLITE_INTEGER;
	for (int i = 0; i < argc; ++i) {
		int type = sqlite3_value_type(argv[i]);
		if (type == SQLITE_NULL) {
			res_type = SQLITE_NULL;
		} else {
			sum += sqlite3_value_int(argv[i]);
		}
	}
	if (res_type == SQLITE_NULL) {
		sqlite3_result_null(context);
	} else {
		sqlite3_result_int(context, sum);
	}
}